

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O2

void __thiscall CBlock::CBlock(CBlock *this,CBlockHeader *header)

{
  long lVar1;
  long in_FS_OFFSET;
  byte bVar2;
  
  bVar2 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::CBlockHeader(&this->super_CBlockHeader);
  (this->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_checked_witness_commitment = false;
  this->m_checked_merkle_root = false;
  SetNull(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    for (lVar1 = 0x14; lVar1 != 0; lVar1 = lVar1 + -1) {
      (this->super_CBlockHeader).nVersion = header->nVersion;
      header = (CBlockHeader *)((long)header + (ulong)bVar2 * -8 + 4);
      this = (CBlock *)((long)this + (ulong)bVar2 * -8 + 4);
    }
    return;
  }
  __stack_chk_fail();
}

Assistant:

CBlock(const CBlockHeader &header)
    {
        SetNull();
        *(static_cast<CBlockHeader*>(this)) = header;
    }